

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O1

int msr_is_constraint_supported
              (raplcap_msr_ctx *ctx,raplcap_zone zone,raplcap_constraint constraint)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RCX;
  uint *puVar3;
  ulong extraout_RDX;
  long *plVar4;
  uint *in_R8;
  long lVar5;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x1e6,
                  "int msr_is_constraint_supported(const raplcap_msr_ctx *, raplcap_zone, raplcap_constraint)"
                 );
  }
  if (constraint == RAPLCAP_CONSTRAINT_LONG_TERM) {
    uVar2 = 1;
  }
  else {
    puVar3 = (uint *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    if (constraint != RAPLCAP_CONSTRAINT_SHORT_TERM) {
      if (constraint != RAPLCAP_CONSTRAINT_PEAK_POWER) {
        plVar4 = (long *)(ulong)constraint;
        msr_is_constraint_supported_cold_1();
        if (plVar4 == (long *)0x0) {
          __assert_fail("ctx != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                        ,0x209,
                        "int msr_is_zone_enabled(const raplcap_msr_ctx *, raplcap_zone, uint64_t, int *, int *)"
                       );
        }
        lVar5 = 0x2f;
        iVar1 = 0xf;
        if ((zone == RAPLCAP_ZONE_PSYS) && ((*(uint *)(plVar4 + 6) | 0x40) == 0xcf)) {
          lVar5 = 0x31;
          iVar1 = 0x11;
        }
        if (puVar3 != (uint *)0x0) {
          *puVar3 = (uint)(((uint)extraout_RDX >> iVar1 & 1) != 0);
        }
        uVar2 = (uint)(puVar3 != (uint *)0x0);
        if ((in_R8 != (uint *)0x0) && (1 < *(byte *)(*plVar4 + 0x28 + (ulong)zone * 0x30))) {
          *in_R8 = (uint)((extraout_RDX >> lVar5 & 1) != 0);
          uVar2 = uVar2 + 1;
        }
        return uVar2;
      }
      puVar3 = (uint *)0x2;
    }
    uVar2 = (uint)((byte)puVar3 < ctx->cfg[zone].constraints);
  }
  return uVar2;
}

Assistant:

int msr_is_constraint_supported(const raplcap_msr_ctx* ctx, raplcap_zone zone, raplcap_constraint constraint) {
  assert(ctx != NULL);
  int ret;
  switch (constraint) {
    case RAPLCAP_CONSTRAINT_LONG_TERM:
      ret = 1;
      break;
    case RAPLCAP_CONSTRAINT_SHORT_TERM:
      ret = HAS_SHORT_TERM(ctx, zone);
      break;
    case RAPLCAP_CONSTRAINT_PEAK_POWER:
      ret = HAS_MAX_POWER(ctx, zone);
      break;
    default:
      ret = -1;
      raplcap_log(ERROR, "Unknown constraint: %d\n", constraint);
      raplcap_log(ERROR, "Please report a bug if you see this message, it should never occur!\n");
      assert(0);
      break;
  }
  raplcap_log(DEBUG, "msr_is_constraint_supported: zone=%d, constraint=%d, supported=%d\n", zone, constraint, ret);
  return ret;
}